

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O1

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::ViewportArrayTestInstance>::createInstance
          (InstanceFactory<vkt::DynamicState::(anonymous_namespace)::ViewportArrayTestInstance>
           *this,Context *context)

{
  vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  *this_00;
  char *vertexShaderName;
  DynamicStateBaseClass *this_01;
  mapped_type *ppcVar1;
  VkPhysicalDeviceFeatures *pVVar2;
  NotSupportedError *pNVar3;
  int i;
  int iVar4;
  float fVar5;
  undefined1 local_98 [12];
  float local_8c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  DynamicStateBaseClass *local_78;
  RGBA local_70;
  float fStack_6c;
  float afStack_68 [2];
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_60;
  
  this_01 = (DynamicStateBaseClass *)operator_new(0x1c8);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_60,&(this->m_shaderPaths)._M_t);
  local_98._0_4_ = 0.0;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_60,(key_type *)local_98);
  vertexShaderName = *ppcVar1;
  local_70.m_value = 1;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_60,&local_70.m_value);
  DynamicStateBaseClass::DynamicStateBaseClass(this_01,context,vertexShaderName,*ppcVar1);
  (this_01->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ViewportArrayTestInstance_00d5eb58;
  local_98._0_4_ = 2.8026e-45;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_60,(key_type *)local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(this_01 + 1),*ppcVar1,(allocator<char> *)&local_70);
  pVVar2 = Context::getDeviceFeatures((this_01->super_TestInstance).m_context);
  if (pVVar2->multiViewport == 0) {
    pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Multi-viewport is not supported","");
    tcu::NotSupportedError::NotSupportedError(pNVar3,(string *)local_98);
    __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (pVVar2->geometryShader != 0) {
    this_00 = &this_01->m_data;
    iVar4 = 0;
    local_78 = this_01;
    do {
      fVar5 = (float)iVar4 / 3.0;
      tcu::RGBA::toVec(&local_70);
      local_98._0_8_ = (pointer)0x3f800000bf800000;
      local_8c = 1.0;
      local_88._M_allocated_capacity = CONCAT44(fStack_6c,local_70.m_value);
      local_88._8_4_ = afStack_68[0];
      local_88._12_4_ = afStack_68[1];
      local_98._8_4_ = fVar5;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_00,(PositionColorVertex *)local_98);
      tcu::RGBA::toVec(&local_70);
      local_98._0_8_ = (pointer)0x3f8000003f800000;
      local_8c = 1.0;
      local_88._M_allocated_capacity = CONCAT44(fStack_6c,local_70.m_value);
      local_88._8_4_ = afStack_68[0];
      local_88._12_4_ = afStack_68[1];
      local_98._8_4_ = fVar5;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_00,(PositionColorVertex *)local_98);
      tcu::RGBA::toVec(&local_70);
      local_98._0_8_ = (pointer)0xbf800000bf800000;
      local_8c = 1.0;
      local_88._M_allocated_capacity = CONCAT44(fStack_6c,local_70.m_value);
      local_88._8_4_ = afStack_68[0];
      local_88._12_4_ = afStack_68[1];
      local_98._8_4_ = fVar5;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_00,(PositionColorVertex *)local_98);
      tcu::RGBA::toVec(&local_70);
      local_98._0_8_ = (pointer)0xbf8000003f800000;
      local_8c = 1.0;
      local_88._M_allocated_capacity = CONCAT44(fStack_6c,local_70.m_value);
      local_88._8_4_ = afStack_68[0];
      local_88._12_4_ = afStack_68[1];
      local_98._8_4_ = fVar5;
      std::
      vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
      ::emplace_back<vkt::DynamicState::PositionColorVertex>
                (this_00,(PositionColorVertex *)local_98);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 4);
    DynamicStateBaseClass::initialize(this_01);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree(&local_60);
    return &this_01->super_TestInstance;
  }
  pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_98._0_8_ = &local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Geometry shaders are not supported","");
  tcu::NotSupportedError::NotSupportedError(pNVar3,(string *)local_98);
  __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}